

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

float Rml::ComputeAngle(NumericValue value)

{
  code *pcVar1;
  bool bVar2;
  float fVar3;
  float local_14;
  Unit UStack_10;
  NumericValue value_local;
  
  UStack_10 = value.unit;
  local_14 = value.number;
  if (UStack_10 != NUMBER) {
    if (UStack_10 == DEG) {
      fVar3 = Math::DegreesToRadians(local_14);
      return fVar3;
    }
    if (UStack_10 != RAD) {
      bVar2 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0x6f);
      if (bVar2) {
        return 0.0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return local_14;
}

Assistant:

float ComputeAngle(NumericValue value)
{
	switch (value.unit)
	{
	case Unit::NUMBER:
	case Unit::RAD: return value.number;

	case Unit::DEG: return Math::DegreesToRadians(value.number);
	default: break;
	}

	RMLUI_ERROR;
	return 0.0f;
}